

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O0

int plugin_loader_library_suffix(plugin_loader_conflict l,char *name,size_t name_length)

{
  undefined1 *puVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  char *result;
  uint local_4;
  
  puVar1 = (undefined1 *)malloc(in_RDX + 2);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x5f;
    memcpy(puVar1 + 1,in_RSI,in_RDX);
    puVar1[in_RDX + 1] = 0;
    *(undefined1 **)(in_RDI + 8) = puVar1;
  }
  else {
    log_write_impl_va("metacall",0x47,"plugin_loader_library_suffix",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                      ,LOG_LEVEL_ERROR,"Invalid plugin loader library suffix allocation");
  }
  local_4 = (uint)(puVar1 == (undefined1 *)0x0);
  return local_4;
}

Assistant:

int plugin_loader_library_suffix(plugin_loader l, const char *name, size_t name_length)
{
	/* This generates a suffix string for the library name */
	/* They are in the form of: <plugin_name>_<manager_name>[d] */
	/* For example, in Linux with Debug: rapid_json_seriald */

#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
	static const size_t extra_length = 3; /* 3: for the _ at the begining and d\0 at the end */
#else
	static const size_t extra_length = 2; /* 3: for the _ at the begining and \0 at the end */

#endif

	char *result = malloc(sizeof(char) * (name_length + extra_length));

	if (result == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin loader library suffix allocation");
		return 1;
	}

	result[0] = '_';

	memcpy(&result[1], name, name_length);

#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
	result[1 + name_length] = 'd';
	++name_length;
#endif

	result[1 + name_length] = '\0';

	l->library_suffix = result;

	return 0;
}